

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

char * libxml_buildMessage(char *msg,__va_list_tag *ap)

{
  int iVar1;
  char *str;
  int chars;
  __va_list_tag *ap_local;
  char *msg_local;
  
  msg_local = (char *)(*_xmlMalloc)(1000);
  if (msg_local == (char *)0x0) {
    msg_local = (char *)0x0;
  }
  else {
    iVar1 = vsnprintf(msg_local,999,msg,ap);
    if (0x3e5 < iVar1) {
      msg_local[999] = '\0';
    }
  }
  return msg_local;
}

Assistant:

static char *
libxml_buildMessage(const char *msg, va_list ap)
{
    int chars;
    char *str;

    str = (char *) xmlMalloc(1000);
    if (str == NULL)
        return NULL;

    chars = vsnprintf(str, 999, msg, ap);
    if (chars >= 998)
        str[999] = 0;

    return str;
}